

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlSchemaValPtr xmlSchemaNewQNameValue(xmlChar *namespaceName,xmlChar *localName)

{
  xmlSchemaValPtr pxVar1;
  
  pxVar1 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar1 != (xmlSchemaValPtr)0x0) {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->next = (_xmlSchemaVal *)0x0;
    (pxVar1->value).decimal.str = (xmlChar *)0x0;
    (pxVar1->value).dur.day = 0;
    (pxVar1->value).date.sec = 0.0;
    *(undefined8 *)((long)&pxVar1->value + 0x18) = 0;
    pxVar1->type = XML_SCHEMAS_QNAME;
    (pxVar1->value).decimal.str = localName;
    (pxVar1->value).qname.uri = namespaceName;
  }
  return pxVar1;
}

Assistant:

xmlSchemaValPtr
xmlSchemaNewQNameValue(const xmlChar *namespaceName,
		       const xmlChar *localName)
{
    xmlSchemaValPtr val;

    val = xmlSchemaNewValue(XML_SCHEMAS_QNAME);
    if (val == NULL)
	return (NULL);

    val->value.qname.name = (xmlChar *) localName;
    val->value.qname.uri = (xmlChar *) namespaceName;
    return(val);
}